

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<QString,_QMap<QString,_QVariant>_>::insert
          (QMap<QString,_QMap<QString,_QVariant>_> *this,QString *key,QMap<QString,_QVariant> *value
          )

{
  long lVar1;
  bool bVar2;
  QMap<QString,_QMap<QString,_QVariant>_> *in_RDI;
  long in_FS_OFFSET;
  QMap<QString,_QMap<QString,_QVariant>_> copy;
  iterator in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  key_type *in_stack_ffffffffffffffd0;
  map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
  *this_00;
  iterator local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
             *)0xaaaaaaaaaaaaaaaa;
  bVar2 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
          ::isShared(&in_RDI->d);
  if (bVar2) {
    QMap(in_RDI,(QMap<QString,_QMap<QString,_QVariant>_> *)in_stack_ffffffffffffff98._M_node);
  }
  else {
    memset(&stack0xffffffffffffffd8,0,8);
    QMap((QMap<QString,_QMap<QString,_QVariant>_> *)0x1202c2);
  }
  detach(in_RDI);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
                *)0x1202d6);
  std::
  map<QString,QMap<QString,QVariant>,std::less<QString>,std::allocator<std::pair<QString_const,QMap<QString,QVariant>>>>
  ::insert_or_assign<QMap<QString,QVariant>const&>
            (this_00,in_stack_ffffffffffffffd0,
             (QMap<QString,_QVariant> *)
             CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  iterator::iterator((iterator *)0x120320,in_stack_ffffffffffffff98);
  ~QMap((QMap<QString,_QMap<QString,_QVariant>_> *)0x12032a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)(iterator)local_20._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. In case of assignment, why copying first?
        detach();
        return iterator(d->m.insert_or_assign(key, value).first);
    }